

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfcd.h
# Opt level: O2

UBool icu_63::CollationFCD::mayHaveLccc(UChar32 c)

{
  ulong uVar1;
  
  if (0x2ff < c) {
    uVar1 = (ulong)(((uint)c >> 10) + 0xd7c0 & 0xffff);
    if ((uint)c < 0x10000) {
      uVar1 = (ulong)(uint)c;
    }
    if ((ulong)(byte)lcccIndex[uVar1 >> 5] != 0) {
      return (*(uint *)(lcccBits + (ulong)(byte)lcccIndex[uVar1 >> 5] * 4) >> ((uint)uVar1 & 0x1f) &
             1) != 0;
    }
  }
  return '\0';
}

Assistant:

static inline UBool mayHaveLccc(UChar32 c) {
        // Handles all of Unicode 0..10FFFF.
        // c can be negative, e.g., U_SENTINEL.
        // U+0300 is the first character with lccc!=0.
        if(c < 0x300) { return FALSE; }
        if(c > 0xffff) { c = U16_LEAD(c); }
        int32_t i;
        return
            (i = lcccIndex[c >> 5]) != 0 &&
            (lcccBits[i] & ((uint32_t)1 << (c & 0x1f))) != 0;
    }